

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O2

void __thiscall
anon_unknown.dwarf_bd106c::cmLBDepend::GenerateDependInformation
          (cmLBDepend *this,cmDependInformation *info)

{
  string *psVar1;
  cmMakefile *this_00;
  pointer pbVar2;
  bool bVar3;
  byte bVar4;
  bool bVar5;
  __type _Var6;
  long lVar7;
  cmSourceFile *pcVar8;
  string *psVar9;
  const_iterator __begin4;
  char cVar10;
  string *filename;
  string *path;
  pointer pbVar11;
  string_view str;
  cmAlphaNum local_348;
  string *local_318;
  cmAlphaNum local_310;
  string line;
  string includeFile;
  string root;
  string local_278;
  string cxxFile;
  ifstream fin;
  size_type local_230;
  byte abStack_218 [488];
  
  if (info->DependDone != false) {
    return;
  }
  info->DependDone = true;
  if ((info->FullPath)._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fin,"Attempt to find dependencies for file without path!",
               (allocator<char> *)&local_348);
    cmSystemTools::Error((string *)&fin);
    goto LAB_002c1975;
  }
  filename = &info->FullPath;
  bVar3 = cmsys::SystemTools::FileExists(filename,true);
  if (bVar3) {
    std::ifstream::ifstream(&fin,(filename->_M_dataplus)._M_p,_S_in);
    if ((abStack_218[*(long *)(_fin + -0x18)] & 5) == 0) {
      line._M_dataplus._M_p = (pointer)&line.field_2;
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      local_318 = filename;
LAB_002c19d2:
      do {
        bVar3 = cmsys::SystemTools::GetLineFromStream
                          ((istream *)&fin,&line,(bool *)0x0,0xffffffffffffffff);
        if (!bVar3) goto LAB_002c1ecc;
        str._M_str = line._M_dataplus._M_p;
        str._M_len = line._M_string_length;
        bVar3 = cmHasLiteralPrefix<9ul>(str,(char (*) [9])"#include");
        if (bVar3) {
          cVar10 = (char)&line;
          lVar7 = std::__cxx11::string::find(cVar10,0x22);
          if (lVar7 == -1) {
            lVar7 = std::__cxx11::string::find(cVar10,0x3c);
            if (lVar7 == -1) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_348,"unknown include directive ",&line);
              cmSystemTools::Error((string *)&local_348);
              std::__cxx11::string::~string((string *)&local_348);
              goto LAB_002c19d2;
            }
            bVar4 = 0x3e;
          }
          else {
            bVar4 = 0x22;
          }
          std::__cxx11::string::find((char)&line,(ulong)bVar4);
          std::__cxx11::string::substr((ulong)&includeFile,(ulong)&line);
          bVar3 = cmsys::RegularExpression::find
                            (&this->IncludeFileRegularExpression,includeFile._M_dataplus._M_p);
          if (bVar3) {
            AddDependency(this,info,&includeFile);
            std::__cxx11::string::string((string *)&cxxFile,(string *)&includeFile);
            lVar7 = std::__cxx11::string::rfind((char)&cxxFile,0x2e);
            if (lVar7 != -1) {
              std::__cxx11::string::substr((ulong)&root,(ulong)&cxxFile);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_348,&root,".cxx");
              std::__cxx11::string::operator=((string *)&cxxFile,(string *)&local_348);
              std::__cxx11::string::~string((string *)&local_348);
              bVar3 = cmsys::SystemTools::FileExists(&cxxFile);
              pbVar2 = (this->IncludeDirectories).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (pbVar11 = (this->IncludeDirectories).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar2;
                  pbVar11 = pbVar11 + 1) {
                local_348.View_._M_str = (pbVar11->_M_dataplus)._M_p;
                local_348.View_._M_len = pbVar11->_M_string_length;
                local_310.View_._M_len = 1;
                local_310.View_._M_str = "/";
                cmStrCat<std::__cxx11::string>(&local_278,&local_348,&local_310,&cxxFile);
                bVar5 = cmsys::SystemTools::FileExists(&local_278);
                std::__cxx11::string::~string((string *)&local_278);
                if (bVar5) {
                  bVar3 = true;
                }
              }
              if (bVar3 == false) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_348,&root,".cpp");
                std::__cxx11::string::operator=((string *)&cxxFile,(string *)&local_348);
                std::__cxx11::string::~string((string *)&local_348);
                bVar5 = cmsys::SystemTools::FileExists(&cxxFile);
                if (bVar5) {
                  bVar3 = true;
                }
                pbVar2 = (this->IncludeDirectories).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                for (pbVar11 = (this->IncludeDirectories).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar2;
                    pbVar11 = pbVar11 + 1) {
                  local_348.View_._M_str = (pbVar11->_M_dataplus)._M_p;
                  local_348.View_._M_len = pbVar11->_M_string_length;
                  local_310.View_._M_len = 1;
                  local_310.View_._M_str = "/";
                  cmStrCat<std::__cxx11::string>(&local_278,&local_348,&local_310,&cxxFile);
                  bVar5 = cmsys::SystemTools::FileExists(&local_278);
                  std::__cxx11::string::~string((string *)&local_278);
                  if (bVar5) {
                    bVar3 = true;
                  }
                }
              }
              if (bVar3 == false) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_348,&root,".c");
                std::__cxx11::string::operator=((string *)&cxxFile,(string *)&local_348);
                std::__cxx11::string::~string((string *)&local_348);
                bVar5 = cmsys::SystemTools::FileExists(&cxxFile);
                if (bVar5) {
                  bVar3 = true;
                }
                pbVar2 = (this->IncludeDirectories).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                for (pbVar11 = (this->IncludeDirectories).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar2;
                    pbVar11 = pbVar11 + 1) {
                  local_348.View_._M_str = (pbVar11->_M_dataplus)._M_p;
                  local_348.View_._M_len = pbVar11->_M_string_length;
                  local_310.View_._M_len = 1;
                  local_310.View_._M_str = "/";
                  cmStrCat<std::__cxx11::string>(&local_278,&local_348,&local_310,&cxxFile);
                  bVar5 = cmsys::SystemTools::FileExists(&local_278);
                  std::__cxx11::string::~string((string *)&local_278);
                  if (bVar5) {
                    bVar3 = true;
                  }
                }
              }
              if (bVar3 == false) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_348,&root,".txx");
                std::__cxx11::string::operator=((string *)&cxxFile,(string *)&local_348);
                std::__cxx11::string::~string((string *)&local_348);
                bVar5 = cmsys::SystemTools::FileExists(&cxxFile);
                if (bVar5) {
                  bVar3 = true;
                }
                pbVar2 = (this->IncludeDirectories).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                for (pbVar11 = (this->IncludeDirectories).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar2;
                    pbVar11 = pbVar11 + 1) {
                  local_348.View_._M_str = (pbVar11->_M_dataplus)._M_p;
                  local_348.View_._M_len = pbVar11->_M_string_length;
                  local_310.View_._M_len = 1;
                  local_310.View_._M_str = "/";
                  cmStrCat<std::__cxx11::string>(&local_278,&local_348,&local_310,&cxxFile);
                  bVar5 = cmsys::SystemTools::FileExists(&local_278);
                  std::__cxx11::string::~string((string *)&local_278);
                  if (bVar5) {
                    bVar3 = true;
                  }
                }
              }
              if (bVar3 != false) {
                AddDependency(this,info,&cxxFile);
              }
              std::__cxx11::string::~string((string *)&root);
            }
LAB_002c1eb2:
            std::__cxx11::string::~string((string *)&cxxFile);
          }
          else if (this->Verbose == true) {
            local_348.View_._M_len = (size_t)&DAT_00000009;
            local_348.View_._M_str = "Skipping ";
            local_310.View_._M_len = includeFile._M_string_length;
            local_310.View_._M_str = includeFile._M_dataplus._M_p;
            cmStrCat<char[11],std::__cxx11::string>
                      (&cxxFile,&local_348,&local_310,(char (*) [11])" for file ",local_318);
            cmSystemTools::Error(&cxxFile);
            goto LAB_002c1eb2;
          }
          std::__cxx11::string::~string((string *)&includeFile);
        }
      } while( true );
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_348,
                   "error can not open ",filename);
    cmSystemTools::Error((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_348);
    goto LAB_002c1edf;
  }
  bVar3 = false;
LAB_002c1eef:
  pcVar8 = info->SourceFile;
  if (pcVar8 != (cmSourceFile *)0x0) {
    psVar9 = (pcVar8->Depends).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (pcVar8->Depends).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar9 != psVar1) {
      for (; psVar9 != psVar1; psVar9 = psVar9 + 1) {
        AddDependency(this,info,psVar9);
      }
      return;
    }
  }
  if (!bVar3) {
    this_00 = this->Makefile;
    cmsys::SystemTools::GetFilenameWithoutExtension((string *)&fin,filename);
    pcVar8 = cmMakefile::GetSource(this_00,(string *)&fin,Ambiguous);
    std::__cxx11::string::~string((string *)&fin);
    if (pcVar8 != (cmSourceFile *)0x0) {
      psVar9 = cmSourceFile::ResolveFullPath(pcVar8,(string *)0x0,(string *)0x0);
      _Var6 = std::operator==(psVar9,filename);
      if (_Var6) {
        return;
      }
      pbVar2 = (this->IncludeDirectories).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar11 = (this->IncludeDirectories).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar2;
          pbVar11 = pbVar11 + 1) {
        std::__cxx11::string::string((string *)&fin,(string *)pbVar11);
        if ((local_230 != 0) && (_fin[local_230 - 1] != '/')) {
          std::__cxx11::string::append((char *)&fin);
        }
        std::__cxx11::string::append((string *)&fin);
        psVar9 = cmSourceFile::ResolveFullPath(pcVar8,(string *)0x0,(string *)0x0);
        _Var6 = std::operator==(psVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&fin);
        if (_Var6) {
          bVar3 = true;
          std::__cxx11::string::_M_assign((string *)filename);
        }
        std::__cxx11::string::~string((string *)&fin);
      }
    }
  }
  if (bVar3) {
    return;
  }
  bVar3 = cmsys::RegularExpression::find(&this->ComplainFileRegularExpression,&info->IncludeName);
  if (!bVar3) {
    (info->FullPath)._M_string_length = 0;
    *(info->FullPath)._M_dataplus._M_p = '\0';
    return;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fin,
                 "error cannot find dependencies for ",filename);
  cmSystemTools::Error((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fin);
LAB_002c1975:
  std::__cxx11::string::~string((string *)&fin);
  return;
LAB_002c1ecc:
  std::__cxx11::string::~string((string *)&line);
  filename = local_318;
LAB_002c1edf:
  std::ifstream::~ifstream(&fin);
  bVar3 = true;
  goto LAB_002c1eef;
}

Assistant:

void GenerateDependInformation(cmDependInformation* info)
  {
    // If dependencies are already done, stop now.
    if (info->DependDone) {
      return;
    }
    // Make sure we don't visit the same file more than once.
    info->DependDone = true;

    const std::string& path = info->FullPath;
    if (path.empty()) {
      cmSystemTools::Error(
        "Attempt to find dependencies for file without path!");
      return;
    }

    bool found = false;

    // If the file exists, use it to find dependency information.
    if (cmSystemTools::FileExists(path, true)) {
      // Use the real file to find its dependencies.
      this->DependWalk(info);
      found = true;
    }

    // See if the cmSourceFile for it has any files specified as
    // dependency hints.
    if (info->SourceFile != nullptr) {

      // Get the cmSourceFile corresponding to this.
      const cmSourceFile& cFile = *(info->SourceFile);
      // See if there are any hints for finding dependencies for the missing
      // file.
      if (!cFile.GetDepends().empty()) {
        // Dependency hints have been given.  Use them to begin the
        // recursion.
        for (std::string const& file : cFile.GetDepends()) {
          this->AddDependency(info, file);
        }

        // Found dependency information.  We are done.
        found = true;
      }
    }

    if (!found) {
      // Try to find the file amongst the sources
      cmSourceFile* srcFile = this->Makefile->GetSource(
        cmSystemTools::GetFilenameWithoutExtension(path));
      if (srcFile) {
        if (srcFile->ResolveFullPath() == path) {
          found = true;
        } else {
          // try to guess which include path to use
          for (std::string incpath : this->IncludeDirectories) {
            if (!incpath.empty() && incpath.back() != '/') {
              incpath += "/";
            }
            incpath += path;
            if (srcFile->ResolveFullPath() == incpath) {
              // set the path to the guessed path
              info->FullPath = incpath;
              found = true;
            }
          }
        }
      }
    }

    if (!found) {
      // Couldn't find any dependency information.
      if (this->ComplainFileRegularExpression.find(info->IncludeName)) {
        cmSystemTools::Error("error cannot find dependencies for " + path);
      } else {
        // Destroy the name of the file so that it won't be output as a
        // dependency.
        info->FullPath.clear();
      }
    }
  }